

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void mc_flow_synthesizer(TplParams *tpl_data,int frame_idx,int mi_rows,int mi_cols)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int mi_col;
  int mi_row;
  int mi_width;
  int mi_height;
  BLOCK_SIZE bsize;
  int mi_col_00;
  int mi_row_00;
  
  if (in_ESI != 0) {
    BVar1 = convert_length_to_bsize((uint)*(byte *)(in_RDI + 5));
    uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar1];
    uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [BVar1];
    for (mi_row_00 = 0; mi_row_00 < in_EDX; mi_row_00 = uVar2 + mi_row_00) {
      for (mi_col_00 = 0; mi_col_00 < in_ECX; mi_col_00 = uVar3 + mi_col_00) {
        tpl_model_update((TplParams *)CONCAT44(uVar2,uVar3),mi_row_00,mi_col_00,0);
      }
    }
  }
  return;
}

Assistant:

static void mc_flow_synthesizer(TplParams *tpl_data, int frame_idx, int mi_rows,
                                int mi_cols) {
  if (!frame_idx) {
    return;
  }
  const BLOCK_SIZE bsize = convert_length_to_bsize(tpl_data->tpl_bsize_1d);
  const int mi_height = mi_size_high[bsize];
  const int mi_width = mi_size_wide[bsize];
  assert(mi_height == (1 << tpl_data->tpl_stats_block_mis_log2));
  assert(mi_width == (1 << tpl_data->tpl_stats_block_mis_log2));

  for (int mi_row = 0; mi_row < mi_rows; mi_row += mi_height) {
    for (int mi_col = 0; mi_col < mi_cols; mi_col += mi_width) {
      tpl_model_update(tpl_data, mi_row, mi_col, frame_idx);
    }
  }
}